

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

void __thiscall C3DFile::readParameterSection(C3DFile *this,ifstream *datastream)

{
  int iVar1;
  size_type sVar2;
  mapped_type_conflict *pmVar3;
  undefined1 local_d0 [8];
  ParameterInfo param_info;
  undefined1 local_70 [8];
  GroupInfo group_info;
  bool read_param;
  int group_count;
  int param_count;
  undefined1 auStack_30 [2];
  Sint8 peek_buffer [2];
  ParameterHeader pheader;
  __mbstate_t local_28;
  int parameter_start;
  ifstream *datastream_local;
  C3DFile *this_local;
  
  iVar1 = ((this->header).first_parameter - 1) * 0x200;
  if (iVar1 < 0x200) {
    __assert_fail("parameter_start >= 512",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x88,"void C3DFile::readParameterSection(ifstream &)");
  }
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_30,(long)iVar1);
  std::istream::seekg(datastream,_auStack_30,local_28);
  std::istream::read((char *)datastream,(long)&param_count);
  group_info._39_1_ = 1;
  while ((group_info._39_1_ & 1) != 0) {
    std::istream::read((char *)datastream,(long)&group_count + 2);
    std::istream::seekg((long)datastream,~_S_cur);
    if (group_count._3_1_ < '\0') {
      readGroupInfo((GroupInfo *)local_70,this,datastream);
      std::vector<GroupInfo,_std::allocator<GroupInfo>_>::push_back
                (&this->group_infos,(GroupInfo *)local_70);
      sVar2 = std::vector<GroupInfo,_std::allocator<GroupInfo>_>::size(&this->group_infos);
      param_info._72_4_ = -(int)local_70[1];
      pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](&this->group_id_to_index_map,(key_type *)&param_info.locked);
      *pmVar3 = (int)sVar2 + -1;
      GroupInfo::~GroupInfo((GroupInfo *)local_70);
    }
    else {
      readParameterInfo((ParameterInfo *)local_d0,this,datastream);
      std::vector<ParameterInfo,_std::allocator<ParameterInfo>_>::push_back
                (&this->param_infos,(ParameterInfo *)local_d0);
      if ((short)param_info.name == 0) {
        group_info._39_1_ = 0;
      }
      ParameterInfo::~ParameterInfo((ParameterInfo *)local_d0);
    }
  }
  return;
}

Assistant:

void C3DFile::readParameterSection (ifstream &datastream) {
	// locate the start of the parameter section
	int parameter_start = (header.first_parameter -1) * 512;
	assert (parameter_start >= 512);
	datastream.seekg (parameter_start);

  // first there is a small parameter header that we want to read
	ParameterHeader pheader;
	datastream.read(reinterpret_cast<char *>(&pheader), sizeof(ParameterHeader));
	//cout << (int)pheader.reserved_1 << "\t" << (int)pheader.reserved_2 << "\t" << (int)pheader.num_parameter_blocks << "\t" << (int)pheader.processor_type << endl;

	// then all parameters and groups follow
	Sint8 peek_buffer[2];

	int param_count = 0;
	int group_count = 0;

	bool read_param = true;
	while (read_param) {
		datastream.read(reinterpret_cast<char *>(peek_buffer), sizeof(Sint8) * 2);
		datastream.seekg(-2, ios::cur);

		if (peek_buffer[1] < 0) {
			GroupInfo group_info = readGroupInfo (datastream);
			//print_group_info(group_info);
		
			group_infos.push_back(group_info);

			// we insert the group id into the map so that we can easier get to the
			// group data once we have the group id.
			// Note: we have to insert the negative value as the group id is always
			// negative!
			group_id_to_index_map[-group_info.id] = group_infos.size() - 1;

			// cout << "inserting group " << group_info.name << " at " << static_cast<int>(group_info.id) << endl;

			group_count ++;
		} else {
			ParameterInfo param_info = readParameterInfo(datastream);
			//print_parameter_info(param_info);

			param_infos.push_back(param_info);
			param_count ++;
			if (param_info.next_offset == 0)
				read_param = false;
		}
	}
	/*
	cout << "current position = " << datastream.tellg() << endl;
	cout << "Read " << param_count << " parameters" << endl;
	cout << "Read " << group_count << " groups" << endl;
	*/
}